

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# di.hpp
# Opt level: O2

void __thiscall
boost::ext::di::v1_2_0::core::
pool<boost::ext::di::v1_2_0::aux::type_list<boost::ext::di::v1_2_0::core::dependency<boost::ext::di::v1_2_0::scopes::deduce,ILogger,ConsoleLogger,boost::ext::di::v1_2_0::no_name,void,boost::ext::di::v1_2_0::core::none>,boost::ext::di::v1_2_0::core::dependency<boost::ext::di::v1_2_0::scopes::instance,Engine,std::shared_ptr<Engine>,boost::ext::di::v1_2_0::no_name,void,boost::ext::di::v1_2_0::core::none>>>
::
pool<boost::ext::di::v1_2_0::core::dependency<boost::ext::di::v1_2_0::scopes::deduce,ILogger,ConsoleLogger,boost::ext::di::v1_2_0::no_name,void,boost::ext::di::v1_2_0::core::none>,boost::ext::di::v1_2_0::core::dependency<boost::ext::di::v1_2_0::scopes::instance,Engine,std::shared_ptr<Engine>,boost::ext::di::v1_2_0::no_name,void,boost::ext::di::v1_2_0::core::none>,boost::ext::di::v1_2_0::core::pool<boost::ext::di::v1_2_0::aux::type_list<boost::ext::di::v1_2_0::core::dependency<boost::ext::di::v1_2_0::scopes::deduce,ILogger,ConsoleLogger,boost::ext::di::v1_2_0::no_name,void,boost::ext::di::v1_2_0::core::none>,boost::ext::di::v1_2_0::core::dependency<boost::ext::di::v1_2_0::scopes::instance,Engine,std::shared_ptr<Engine>,boost::ext::di::v1_2_0::no_name,void,boost::ext::di::v1_2_0::core::none>>>>
          (pool<boost::ext::di::v1_2_0::aux::type_list<boost::ext::di::v1_2_0::core::dependency<boost::ext::di::v1_2_0::scopes::deduce,ILogger,ConsoleLogger,boost::ext::di::v1_2_0::no_name,void,boost::ext::di::v1_2_0::core::none>,boost::ext::di::v1_2_0::core::dependency<boost::ext::di::v1_2_0::scopes::instance,Engine,std::shared_ptr<Engine>,boost::ext::di::v1_2_0::no_name,void,boost::ext::di::v1_2_0::core::none>>>
           *this,type_list<boost::ext::di::v1_2_0::core::dependency<boost::ext::di::v1_2_0::scopes::deduce,_ILogger,_ConsoleLogger,_boost::ext::di::v1_2_0::no_name,_void,_boost::ext::di::v1_2_0::core::none>,_boost::ext::di::v1_2_0::core::dependency<boost::ext::di::v1_2_0::scopes::instance,_Engine,_std::shared_ptr<Engine>,_boost::ext::di::v1_2_0::no_name,_void,_boost::ext::di::v1_2_0::core::none>_>
                 *param_1,
          pool<boost::ext::di::v1_2_0::aux::type_list<boost::ext::di::v1_2_0::core::dependency<boost::ext::di::v1_2_0::scopes::deduce,_ILogger,_ConsoleLogger,_boost::ext::di::v1_2_0::no_name,_void,_boost::ext::di::v1_2_0::core::none>,_boost::ext::di::v1_2_0::core::dependency<boost::ext::di::v1_2_0::scopes::instance,_Engine,_std::shared_ptr<Engine>,_boost::ext::di::v1_2_0::no_name,_void,_boost::ext::di::v1_2_0::core::none>_>_>
          *p)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_8;
  
  local_8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar1 = (p->
           super_dependency<boost::ext::di::v1_2_0::scopes::instance,_Engine,_std::shared_ptr<Engine>,_boost::ext::di::v1_2_0::no_name,_void,_boost::ext::di::v1_2_0::core::none>
           ).super_scope<Engine,_std::shared_ptr<Engine>,_int>.object_.
           super___shared_ptr<Engine,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (p->
           super_dependency<boost::ext::di::v1_2_0::scopes::instance,_Engine,_std::shared_ptr<Engine>,_boost::ext::di::v1_2_0::no_name,_void,_boost::ext::di::v1_2_0::core::none>
           ).super_scope<Engine,_std::shared_ptr<Engine>,_int>.object_.
           super___shared_ptr<Engine,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (p->
  super_dependency<boost::ext::di::v1_2_0::scopes::instance,_Engine,_std::shared_ptr<Engine>,_boost::ext::di::v1_2_0::no_name,_void,_boost::ext::di::v1_2_0::core::none>
  ).super_scope<Engine,_std::shared_ptr<Engine>,_int>.object_.
  super___shared_ptr<Engine,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (p->
  super_dependency<boost::ext::di::v1_2_0::scopes::instance,_Engine,_std::shared_ptr<Engine>,_boost::ext::di::v1_2_0::no_name,_void,_boost::ext::di::v1_2_0::core::none>
  ).super_scope<Engine,_std::shared_ptr<Engine>,_int>.object_.
  super___shared_ptr<Engine,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(element_type **)(this + 8) = peVar1;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 0x10) = p_Var2;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_8);
  return;
}

Assistant:

pool(const aux::type_list<Ts...>&, TPool p) noexcept : pool(static_cast<Ts&&>(p)...) {
    (void)p;
  }